

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void RunLoadStorePropagation(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  uint *optCount;
  SmallArray<VmModule::LoadStoreInfo,_32U> *this;
  int iVar1;
  VmInstructionType cmd;
  long lVar2;
  long lVar3;
  VmBlock *this_00;
  TypeBase *pTVar4;
  long *plVar5;
  VmValue **ppVVar6;
  VariableData *pVVar7;
  VmValue **ppVVar8;
  VmValueType VVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  VmValue *pVVar15;
  VmInstruction *pVVar16;
  undefined4 extraout_var;
  VmValue *pVVar17;
  LoadStoreInfo *pLVar18;
  VmInstruction *replacement;
  ulong uVar19;
  VmConstant *pVVar20;
  char *pcVar21;
  VmInstructionType VVar22;
  VmConstant *pVVar23;
  VmValue *pVVar24;
  ulong uVar25;
  SynBase *pSVar26;
  VmConstant *pVVar27;
  int iVar28;
  VmModule *pVVar29;
  long lVar30;
  Allocator *pAVar31;
  VmConstant *this_01;
  ulong uVar32;
  ulong uVar33;
  VmInstruction *pVVar34;
  ulong uVar35;
  VmInstruction *pVVar36;
  VmValue *pVVar37;
  VmType type;
  VmType type_00;
  SmallArray<VmInstruction_*,_32U> deadStores;
  VmModule *pVVar38;
  VmConstant *local_168;
  undefined1 local_148 [272];
  Allocator *local_38;
  undefined4 extraout_var_00;
  
  if (value != (VmValue *)0x0) {
    if (value->typeID == 3) {
      (module->loadStoreInfo).count = 0;
      pVVar36 = (VmInstruction *)value[1].comment.end;
      if (pVVar36 != (VmInstruction *)0x0) {
        optCount = &module->loadStorePropagations;
        this = &module->loadStoreInfo;
        pVVar38 = module;
        do {
          pVVar34 = pVVar36->nextSibling;
          switch(pVVar36->cmd) {
          case VM_INST_LOAD_BYTE:
            pVVar15 = anon_unknown.dwarf_22bf96::GetLoadStoreInfo(module,pVVar36);
            if ((pVVar15 == (VmValue *)0x0) || (pVVar15->typeID != 1)) goto LAB_0027d3cc;
            pAVar31 = module->allocator;
            pSVar26 = pVVar15->source;
            iVar12 = (int)*(char *)&pVVar15[1]._vptr_VmValue;
LAB_0027d3af:
            pVVar16 = (VmInstruction *)CreateConstantInt(pAVar31,pSVar26,iVar12);
LAB_0027d3b4:
            anon_unknown.dwarf_22bf96::ReplaceValueUsersWith
                      (module,&pVVar36->super_VmValue,&pVVar16->super_VmValue,optCount);
            break;
          case VM_INST_LOAD_SHORT:
            pVVar15 = anon_unknown.dwarf_22bf96::GetLoadStoreInfo(module,pVVar36);
            if ((pVVar15 != (VmValue *)0x0) && (pVVar15->typeID == 1)) {
              pAVar31 = module->allocator;
              pSVar26 = pVVar15->source;
              iVar12 = (int)*(short *)&pVVar15[1]._vptr_VmValue;
              goto LAB_0027d3af;
            }
            goto LAB_0027d3cc;
          case VM_INST_LOAD_INT:
          case VM_INST_LOAD_FLOAT:
          case VM_INST_LOAD_DOUBLE:
          case VM_INST_LOAD_LONG:
          case VM_INST_LOAD_STRUCT:
            pVVar16 = (VmInstruction *)anon_unknown.dwarf_22bf96::GetLoadStoreInfo(module,pVVar36);
            if (pVVar16 != (VmInstruction *)0x0) {
              uVar13 = (pVVar36->super_VmValue).type.size;
              uVar14 = (pVVar16->super_VmValue).type.size;
              if (uVar13 != uVar14 ||
                  (pVVar36->super_VmValue).type.type != (pVVar16->super_VmValue).type.type) {
                if (uVar13 != uVar14) {
                  __assert_fail("curr->type.size == prevValue->type.size",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                ,0x14f9,
                                "void RunLoadStorePropagation(ExpressionContext &, VmModule *, VmValue *)"
                               );
                }
                module->currentBlock = (VmBlock *)value;
                value[1].users.data = (VmValue **)pVVar36->prevSibling;
                type.structType = (TypeBase *)0x4e;
                type._0_8_ = (pVVar36->super_VmValue).type.structType;
                pVVar16 = anon_unknown.dwarf_22bf96::CreateInstruction
                                    ((anon_unknown_dwarf_22bf96 *)module,
                                     (VmModule *)(pVVar36->super_VmValue).source,
                                     *(SynBase **)&(pVVar36->super_VmValue).type,type,
                                     (VmInstructionType)pVVar16,(VmValue *)0x0,(VmValue *)0x0,
                                     (VmValue *)0x0,(VmValue *)0x0,(VmValue *)pVVar38);
                value[1].users.data = *(VmValue ***)&value[1].hasSideEffects;
                module->currentBlock = (VmBlock *)0x0;
              }
              goto LAB_0027d3b4;
            }
LAB_0027d3cc:
            anon_unknown.dwarf_22bf96::AddLoadInfo(module,pVVar36);
            break;
          case VM_INST_STORE_BYTE:
          case VM_INST_STORE_SHORT:
          case VM_INST_STORE_INT:
          case VM_INST_STORE_FLOAT:
          case VM_INST_STORE_DOUBLE:
          case VM_INST_STORE_LONG:
          case VM_INST_STORE_STRUCT:
            uVar13 = (pVVar36->arguments).count;
            if ((uVar13 == 0) || (uVar13 == 1)) goto LAB_0027dcf2;
            ppVVar8 = (pVVar36->arguments).data;
            pVVar15 = ppVVar8[1];
            if ((pVVar15 == (VmValue *)0x0) || (pVVar15->typeID != 1)) {
              pVVar15 = (VmValue *)0x0;
            }
            pVVar20 = (VmConstant *)*ppVVar8;
            if (pVVar20 != (VmConstant *)0x0) {
              uVar13 = (pVVar20->super_VmValue).typeID;
              if (uVar13 == 2) {
                if (pVVar20->iValue == 0x16) {
                  uVar13 = (uint)pVVar20->lValue;
                  if (uVar13 == 0) goto LAB_0027dcf2;
                  plVar5 = (long *)pVVar20->dValue;
                  lVar30 = *plVar5;
                  if ((lVar30 == 0) || (*(int *)(lVar30 + 8) != 1)) {
                    lVar30 = 0;
                  }
                  if (uVar13 == 1) goto LAB_0027dcf2;
                  lVar2 = plVar5[1];
                  if (((lVar2 == 0) || (lVar30 == 0)) || (*(int *)(lVar2 + 8) != 1)) {
                    __assert_fail("length && elemSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                  ,0x5f4,
                                  "void (anonymous namespace)::AddStoreInfo(VmModule *, VmInstruction *)"
                                 );
                  }
                  if (uVar13 < 3) goto LAB_0027dcf2;
                  lVar3 = plVar5[2];
                  if ((lVar3 != 0) && (*(int *)(lVar3 + 8) == 1)) {
                    if (uVar13 != 3) {
                      iVar12 = *(int *)(lVar3 + 0x98);
                      iVar1 = *(int *)(lVar2 + 0x98);
                      iVar28 = *(int *)(lVar30 + 0x98) * iVar1;
                      lVar30 = plVar5[3];
                      if ((lVar30 != 0) && (*(int *)(lVar30 + 8) == 1)) {
                        iVar12 = iVar12 + *(int *)(lVar30 + 0x98) * iVar1;
                        iVar28 = iVar1;
                      }
                      anon_unknown.dwarf_22bf96::ClearLoadStoreInfo
                                (module,*(VariableData **)(lVar3 + 200),
                                 iVar12 + *(int *)&pVVar15[1]._vptr_VmValue,
                                 iVar28 - *(int *)&pVVar15[1]._vptr_VmValue);
                      break;
                    }
                    goto LAB_0027dcf2;
                  }
                }
              }
              else if (uVar13 == 1) {
                if (pVVar20->container == (VariableData *)0x0) break;
                if (*(int *)&pVVar15[1]._vptr_VmValue != 0) {
                  __assert_fail("storeOffset->iValue == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                ,0x5d1,
                                "void (anonymous namespace)::AddStoreInfo(VmModule *, VmInstruction *)"
                               );
                }
                pTVar4 = pVVar20->container->type;
                if (((pTVar4 != (TypeBase *)0x0) && (pTVar4->typeID == 0x13)) &&
                   (lVar30._0_4_ = pTVar4[1].typeID, lVar30._4_4_ = pTVar4[1].nameHash,
                   0x20 < lVar30)) break;
                uVar13 = GetAccessSize(pVVar36);
                anon_unknown.dwarf_22bf96::ClearLoadStoreInfo
                          (module,pVVar20->container,pVVar20->iValue,uVar13);
                if (pVVar20->container == (VariableData *)0x0) {
                  bVar10 = false;
                  module = pVVar38;
                }
                else {
                  bVar10 = HasAddressTaken(pVVar20->container);
                  bVar10 = !bVar10;
                  module = pVVar38;
                }
                uVar14 = (module->loadStoreInfo).count;
                if (uVar14 == (module->loadStoreInfo).max) {
                  SmallArray<VmModule::LoadStoreInfo,_32U>::grow(this,uVar14);
                }
                pLVar18 = this->data;
                if (pLVar18 == (LoadStoreInfo *)0x0) goto LAB_0027ddac;
                uVar14 = (module->loadStoreInfo).count;
                uVar33 = (ulong)uVar14;
                (module->loadStoreInfo).count = uVar14 + 1;
                pLVar18[uVar33].loadInst = (VmInstruction *)0x0;
                pLVar18[uVar33].storeInst = pVVar36;
                pLVar18[uVar33].copyInst = (VmInstruction *)0x0;
                pLVar18[uVar33].accessSize = uVar13;
                pLVar18[uVar33].loadAddress = (VmConstant *)0x0;
                (&pLVar18[uVar33].loadAddress)[1] = (VmConstant *)0x0;
                pLVar18[uVar33].loadOffset = (VmConstant *)0x0;
                pLVar18[uVar33].storeAddress = pVVar20;
                pLVar18[uVar33].storePointer = (VmValue *)0x0;
                (&pLVar18[uVar33].storePointer)[1] = (VmValue *)0x0;
                pLVar18[uVar33].noLoadOrNoContainerAlias = true;
                goto LAB_0027d9a6;
              }
            }
LAB_0027d377:
            anon_unknown.dwarf_22bf96::ClearLoadStoreInfoAliasing(module,pVVar36);
            break;
          case VM_INST_SET_RANGE:
switchD_0027ce79_caseD_1a:
            anon_unknown.dwarf_22bf96::ClearLoadStoreInfoAliasing(module,(VmInstruction *)0x0);
            anon_unknown.dwarf_22bf96::ClearLoadStoreInfoGlobal(module);
            break;
          case VM_INST_MEM_COPY:
            uVar13 = (pVVar36->arguments).count;
            if ((uVar13 < 3) || (uVar13 == 3)) goto LAB_0027dcf2;
            ppVVar8 = (pVVar36->arguments).data;
            pVVar20 = (VmConstant *)ppVVar8[3];
            if ((pVVar20 == (VmConstant *)0x0) || ((pVVar20->super_VmValue).typeID != 1)) {
              pVVar20 = (VmConstant *)0x0;
            }
            pVVar15 = ppVVar8[2];
            uVar13 = GetAccessSize(pVVar36);
            pVVar16 = anon_unknown.dwarf_22bf96::GetCopyInfo(pVVar38,pVVar15,pVVar20,uVar13);
            module = pVVar38;
            if (pVVar16 != (VmInstruction *)0x0) {
              uVar13 = (pVVar36->arguments).count;
              if ((((uVar13 == 0) || (uVar13 == 1)) ||
                  (uVar14 = (pVVar16->arguments).count, uVar14 < 3)) ||
                 ((uVar14 == 3 || (uVar13 < 5)))) goto LAB_0027dcf2;
              ppVVar8 = (pVVar36->arguments).data;
              ppVVar6 = (pVVar16->arguments).data;
              anon_unknown.dwarf_22bf96::ChangeInstructionTo
                        ((VmModule *)pVVar38->allocator,pVVar36,pVVar36->cmd,*ppVVar8,ppVVar8[1],
                         ppVVar6[2],ppVVar6[3],ppVVar8[4],optCount);
              module = pVVar38;
            }
            uVar13 = (pVVar36->arguments).count;
            if ((uVar13 == 0) || (uVar13 == 1)) goto LAB_0027dcf2;
            ppVVar8 = (pVVar36->arguments).data;
            pVVar15 = ppVVar8[1];
            if ((pVVar15 == (VmValue *)0x0) || (pVVar15->typeID != 1)) {
              pVVar15 = (VmValue *)0x0;
            }
            pVVar20 = (VmConstant *)*ppVVar8;
            pVVar38 = module;
            if ((pVVar20 == (VmConstant *)0x0) || ((pVVar20->super_VmValue).typeID != 1))
            goto LAB_0027d377;
            if (pVVar20->container == (VariableData *)0x0) break;
            if (*(int *)&pVVar15[1]._vptr_VmValue != 0) {
              __assert_fail("storeOffset->iValue == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x617,
                            "void (anonymous namespace)::AddCopyInfo(VmModule *, VmInstruction *)");
            }
            uVar14 = GetAccessSize(pVVar36);
            uVar13 = (pVVar36->arguments).count;
            if ((uVar13 < 3) || (uVar13 == 3)) goto LAB_0027dcf2;
            ppVVar8 = (pVVar36->arguments).data;
            local_168 = (VmConstant *)ppVVar8[3];
            if ((local_168 == (VmConstant *)0x0) || ((local_168->super_VmValue).typeID != 1)) {
              local_168 = (VmConstant *)0x0;
            }
            pVVar27 = (VmConstant *)ppVVar8[2];
            if (pVVar27 == (VmConstant *)0x0) {
              pVVar23 = (VmConstant *)0x0;
LAB_0027d8c1:
              pVVar27 = (VmConstant *)0x0;
            }
            else {
              pVVar23 = pVVar27;
              if ((pVVar27->super_VmValue).typeID != 1) goto LAB_0027d8c1;
              if (*(int *)&pVVar15[1]._vptr_VmValue != 0) {
                __assert_fail("storeOffset->iValue == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x627,
                              "void (anonymous namespace)::AddCopyInfo(VmModule *, VmInstruction *)"
                             );
              }
              local_168 = (VmConstant *)0x0;
              pVVar23 = (VmConstant *)0x0;
            }
            anon_unknown.dwarf_22bf96::ClearLoadStoreInfo
                      (module,pVVar20->container,pVVar20->iValue,uVar14);
            bVar11 = pVVar23 == (VmConstant *)0x0;
            module = pVVar38;
            if (pVVar27 != (VmConstant *)0x0) {
              if (pVVar27->container == (VariableData *)0x0) {
                bVar11 = false;
              }
              else {
                bVar11 = HasAddressTaken(pVVar27->container);
                bVar11 = !bVar11;
                module = pVVar38;
              }
            }
            if (pVVar20->container == (VariableData *)0x0) {
              bVar10 = false;
            }
            else {
              bVar10 = HasAddressTaken(pVVar20->container);
              bVar10 = !bVar10;
            }
            uVar13 = (module->loadStoreInfo).count;
            if (uVar13 == (module->loadStoreInfo).max) {
              SmallArray<VmModule::LoadStoreInfo,_32U>::grow(this,uVar13);
            }
            pLVar18 = this->data;
            if (pLVar18 == (LoadStoreInfo *)0x0) {
LAB_0027ddac:
              pcVar21 = 
              "void SmallArray<VmModule::LoadStoreInfo, 32>::push_back(const T &) [T = VmModule::LoadStoreInfo, N = 32]"
              ;
LAB_0027dd26:
              __assert_fail("data",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x162,pcVar21);
            }
            uVar13 = (module->loadStoreInfo).count;
            uVar33 = (ulong)uVar13;
            (module->loadStoreInfo).count = uVar13 + 1;
            pLVar18[uVar33].loadInst = (VmInstruction *)0x0;
            pLVar18[uVar33].storeInst = (VmInstruction *)0x0;
            pLVar18[uVar33].copyInst = pVVar36;
            pLVar18[uVar33].accessSize = uVar14;
            pLVar18[uVar33].loadAddress = pVVar27;
            pLVar18[uVar33].loadPointer = &pVVar23->super_VmValue;
            pLVar18[uVar33].loadOffset = local_168;
            pLVar18[uVar33].storeAddress = pVVar20;
            pLVar18[uVar33].storePointer = (VmValue *)0x0;
            (&pLVar18[uVar33].storePointer)[1] = (VmValue *)0x0;
            pLVar18[uVar33].noLoadOrNoContainerAlias = bVar11;
LAB_0027d9a6:
            pLVar18[uVar33].noStoreOrNoContainerAlias = bVar10;
            pVVar38 = module;
            break;
          case VM_INST_CALL:
            uVar13 = (pVVar36->arguments).count;
            if (uVar13 == 0) goto LAB_0027dcf2;
            ppVVar8 = (pVVar36->arguments).data;
            if (((*ppVVar8)->type).type == VM_TYPE_FUNCTION_REF) {
              uVar14 = 2;
LAB_0027d59b:
              pVVar15 = (VmValue *)0x0;
            }
            else {
              if (uVar13 == 1) goto LAB_0027dcf2;
              pVVar15 = ppVVar8[1];
              if ((pVVar15 == (VmValue *)0x0) || (uVar14 = 3, pVVar15->typeID != 4)) {
                uVar14 = 3;
                goto LAB_0027d59b;
              }
            }
            if (uVar14 < uVar13) {
              uVar33 = (ulong)uVar14;
              module = pVVar38;
              do {
                pVVar37 = (pVVar36->arguments).data[uVar33];
                if ((((pVVar37 != (VmValue *)0x0) && (pVVar37->typeID == 1)) &&
                    (pVVar37[1].hasMemoryAccess == true)) &&
                   (pVVar16 = anon_unknown.dwarf_22bf96::GetCopyInfo
                                        (module,pVVar37,(VmConstant *)0x0,(pVVar37->type).size),
                   pVVar16 != (VmInstruction *)0x0)) {
                  if ((pVVar16->arguments).count < 3) goto LAB_0027dcf2;
                  pVVar24 = (pVVar16->arguments).data[2];
                  if ((pVVar24 != (VmValue *)0x0) && (pVVar24->typeID == 1)) {
                    iVar12 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
                    pVVar17 = (VmValue *)CONCAT44(extraout_var_00,iVar12);
                    pAVar31 = ctx->allocator;
                    VVar9 = (pVVar37->type).type;
                    uVar13 = (pVVar37->type).size;
                    pTVar4 = (pVVar37->type).structType;
                    pSVar26 = (pVVar36->super_VmValue).source;
                    pVVar17->typeID = 1;
                    (pVVar17->type).type = VVar9;
                    (pVVar17->type).size = uVar13;
                    (pVVar17->type).structType = pTVar4;
                    pVVar17->source = pSVar26;
                    (pVVar17->comment).begin = (char *)0x0;
                    (pVVar17->comment).end = (char *)0x0;
                    (pVVar17->users).allocator = pAVar31;
                    (pVVar17->users).data = (pVVar17->users).little;
                    (pVVar17->users).count = 0;
                    (pVVar17->users).max = 8;
                    pVVar17->hasKnownNonSimpleUse = false;
                    pVVar17->hasSideEffects = false;
                    pVVar17->hasMemoryAccess = false;
                    pVVar17->canBeRemoved = true;
                    pVVar17->hasKnownSimpleUse = false;
                    pVVar17->_vptr_VmValue = (_func_int **)&PTR__VmValue_003e8d38;
                    *(undefined4 *)&pVVar17[1]._vptr_VmValue = 0;
                    *(undefined8 *)&pVVar17[1].typeID = 0;
                    pVVar17[1].type.type = VM_TYPE_VOID;
                    pVVar17[1].type.size = 0;
                    pVVar17[1].type.structType = (TypeBase *)0x0;
                    pVVar17[1].source = (SynBase *)0x0;
                    pVVar17[1].comment.begin = (char *)0x0;
                    pVVar17[1].comment.end = (char *)0x0;
                    pVVar17[1].hasSideEffects = false;
                    pVVar17[1].hasMemoryAccess = false;
                    *(undefined4 *)&pVVar17[1]._vptr_VmValue =
                         *(undefined4 *)&pVVar24[1]._vptr_VmValue;
                    pcVar21 = pVVar24[1].comment.end;
                    pVVar17[1].comment.end = pcVar21;
                    pVVar17[1].hasMemoryAccess = true;
                    if (*(uint *)(pcVar21 + 0x50) == *(uint *)(pcVar21 + 0x54)) {
                      SmallArray<VmConstant_*,_8U>::grow
                                ((SmallArray<VmConstant_*,_8U> *)(pcVar21 + 0x48),
                                 *(uint *)(pcVar21 + 0x50));
                    }
                    lVar30 = (long)((SmallArray<VmConstant_*,_8U> *)(pcVar21 + 0x48))->data;
                    if (lVar30 == 0) {
                      pcVar21 = 
                      "void SmallArray<VmConstant *, 8>::push_back(const T &) [T = VmConstant *, N = 8]"
                      ;
                      goto LAB_0027dd26;
                    }
                    uVar13 = *(uint *)(pcVar21 + 0x50);
                    *(uint *)(pcVar21 + 0x50) = uVar13 + 1;
                    *(VmValue **)(lVar30 + (ulong)uVar13 * 8) = pVVar17;
                    pcVar21 = (pVVar37->comment).end;
                    (pVVar17->comment).begin = (pVVar37->comment).begin;
                    (pVVar17->comment).end = pcVar21;
                    VmValue::AddUse(pVVar17,&pVVar36->super_VmValue);
                    if (((pVVar36->arguments).count <= uVar33) ||
                       (VmValue::RemoveUse((pVVar36->arguments).data[uVar33],&pVVar36->super_VmValue
                                          ), (pVVar36->arguments).count <= uVar33))
                    goto LAB_0027dcf2;
                    (pVVar36->arguments).data[uVar33] = pVVar17;
                  }
                }
                uVar33 = uVar33 + 1;
                uVar13 = (pVVar36->arguments).count;
                pVVar38 = module;
              } while (uVar33 < uVar13);
            }
            if (uVar13 <= uVar14 - 1) goto LAB_0027dcf2;
            pVVar37 = (pVVar36->arguments).data[uVar14 - 1];
            if (((pVVar37 != (VmValue *)0x0) && (pVVar37->typeID == 1)) &&
               (pVVar37[1].hasMemoryAccess == true)) {
              anon_unknown.dwarf_22bf96::ClearLoadStoreInfo
                        (module,(VariableData *)pVVar37[1].comment.end,
                         *(uint *)&pVVar37[1]._vptr_VmValue,(pVVar37->type).size);
            }
            if ((pVVar15 == (VmValue *)0x0) ||
               ((*(byte *)((long)pVVar15[1]._vptr_VmValue + 0x14) & 1) == 0))
            goto switchD_0027ce79_caseD_1a;
            break;
          case VM_INST_RETURN:
            if (((((pVVar36->arguments).count != 0) &&
                 (pVVar15 = *(pVVar36->arguments).data, pVVar15 != (VmValue *)0x0)) &&
                (pVVar15->typeID == 1)) &&
               ((pVVar15[1].hasMemoryAccess == true &&
                (pVVar16 = anon_unknown.dwarf_22bf96::GetCopyInfo
                                     (module,pVVar15,(VmConstant *)0x0,(pVVar15->type).size),
                pVVar16 != (VmInstruction *)0x0)))) {
              if ((pVVar16->arguments).count < 3) goto LAB_0027dcf2;
              pVVar37 = (pVVar16->arguments).data[2];
              if ((pVVar37 != (VmValue *)0x0) && (pVVar37->typeID == 1)) {
                iVar12 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
                local_148._0_8_ = CONCAT44(extraout_var,iVar12);
                pAVar31 = ctx->allocator;
                VVar9 = (pVVar15->type).type;
                uVar13 = (pVVar15->type).size;
                pTVar4 = (pVVar15->type).structType;
                pSVar26 = (pVVar36->super_VmValue).source;
                (((VmConstant *)local_148._0_8_)->super_VmValue).typeID = 1;
                (((VmConstant *)local_148._0_8_)->super_VmValue).type.type = VVar9;
                (((VmConstant *)local_148._0_8_)->super_VmValue).type.size = uVar13;
                (((VmConstant *)local_148._0_8_)->super_VmValue).type.structType = pTVar4;
                (((VmConstant *)local_148._0_8_)->super_VmValue).source = pSVar26;
                (((VmConstant *)local_148._0_8_)->super_VmValue).comment.begin = (char *)0x0;
                (((VmConstant *)local_148._0_8_)->super_VmValue).comment.end = (char *)0x0;
                (((VmConstant *)local_148._0_8_)->super_VmValue).users.allocator = pAVar31;
                (((VmConstant *)local_148._0_8_)->super_VmValue).users.data =
                     (((VmConstant *)local_148._0_8_)->super_VmValue).users.little;
                (((VmConstant *)local_148._0_8_)->super_VmValue).users.count = 0;
                (((VmConstant *)local_148._0_8_)->super_VmValue).users.max = 8;
                (((VmConstant *)local_148._0_8_)->super_VmValue).hasKnownNonSimpleUse = false;
                (((VmConstant *)local_148._0_8_)->super_VmValue).hasSideEffects = false;
                (((VmConstant *)local_148._0_8_)->super_VmValue).hasMemoryAccess = false;
                (((VmConstant *)local_148._0_8_)->super_VmValue).canBeRemoved = true;
                (((VmConstant *)local_148._0_8_)->super_VmValue).hasKnownSimpleUse = false;
                (((VmConstant *)local_148._0_8_)->super_VmValue)._vptr_VmValue =
                     (_func_int **)&PTR__VmValue_003e8d38;
                ((VmConstant *)local_148._0_8_)->iValue = 0;
                ((VmConstant *)local_148._0_8_)->dValue = 0.0;
                ((VmConstant *)local_148._0_8_)->lValue = 0;
                ((VmConstant *)local_148._0_8_)->sValue = (char *)0x0;
                ((VmConstant *)local_148._0_8_)->bValue = (VmBlock *)0x0;
                ((VmConstant *)local_148._0_8_)->fValue = (VmFunction *)0x0;
                ((VmConstant *)local_148._0_8_)->container = (VariableData *)0x0;
                ((VmConstant *)local_148._0_8_)->isFloat = false;
                ((VmConstant *)local_148._0_8_)->isReference = false;
                ((VmConstant *)local_148._0_8_)->iValue = *(int *)&pVVar37[1]._vptr_VmValue;
                pVVar7 = (VariableData *)pVVar37[1].comment.end;
                ((VmConstant *)local_148._0_8_)->container = pVVar7;
                ((VmConstant *)local_148._0_8_)->isReference = true;
                SmallArray<VmConstant_*,_8U>::push_back(&pVVar7->users,(VmConstant **)local_148);
                VVar22 = pVVar36->cmd;
                pVVar29 = (VmModule *)module->allocator;
                pVVar15 = (VmValue *)0x0;
                pVVar20 = (VmConstant *)local_148._0_8_;
                goto LAB_0027cf58;
              }
            }
            break;
          case VM_INST_ADD_LOAD:
          case VM_INST_SUB_LOAD:
          case VM_INST_MUL_LOAD:
          case VM_INST_DIV_LOAD:
          case VM_INST_POW_LOAD:
          case VM_INST_MOD_LOAD:
          case VM_INST_LESS_LOAD:
          case VM_INST_GREATER_LOAD:
          case VM_INST_LESS_EQUAL_LOAD:
          case VM_INST_GREATER_EQUAL_LOAD:
          case VM_INST_EQUAL_LOAD:
          case VM_INST_NOT_EQUAL_LOAD:
          case VM_INST_SHL_LOAD:
          case VM_INST_SHR_LOAD:
          case VM_INST_BIT_AND_LOAD:
          case VM_INST_BIT_OR_LOAD:
          case VM_INST_BIT_XOR_LOAD:
            uVar13 = (pVVar36->arguments).count;
            if ((uVar13 < 2) || (uVar13 == 2)) goto LAB_0027dcf2;
            ppVVar8 = (pVVar36->arguments).data;
            pVVar20 = (VmConstant *)ppVVar8[2];
            if ((pVVar20 == (VmConstant *)0x0) || ((pVVar20->super_VmValue).typeID != 1)) {
              pVVar20 = (VmConstant *)0x0;
            }
            if (uVar13 < 4) goto LAB_0027dcf2;
            pVVar15 = ppVVar8[3];
            uVar13 = *(int *)&pVVar15[1]._vptr_VmValue - 2;
            if (3 < uVar13) {
              __assert_fail("loadSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x15aa,
                            "void RunLoadStorePropagation(ExpressionContext &, VmModule *, VmValue *)"
                           );
            }
            pVVar37 = ppVVar8[1];
            uVar13 = *(uint *)(&DAT_0035cce0 + (ulong)uVar13 * 4);
            module = pVVar38;
            uVar14 = GetAccessSize(pVVar36);
            pVVar38 = module;
            pVVar15 = anon_unknown.dwarf_22bf96::GetLoadStoreInfo
                                (module,pVVar37,pVVar20,uVar13,uVar14,
                                 *(VmInstructionType *)&pVVar15[1]._vptr_VmValue);
            if (pVVar15 != (VmValue *)0x0) {
              if (0x10 < pVVar36->cmd - VM_INST_ADD_LOAD) {
                __assert_fail("!\"unknown operation\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x10d,
                              "VmInstructionType (anonymous namespace)::GetOperationWithoutLoad(VmInstructionType)"
                             );
              }
              if ((pVVar36->arguments).count == 0) goto LAB_0027dcf2;
              VVar22 = pVVar36->cmd - VM_INST_DOUBLE_TO_FLOAT;
              pVVar29 = (VmModule *)module->allocator;
              pVVar20 = (VmConstant *)*(pVVar36->arguments).data;
LAB_0027cf58:
              anon_unknown.dwarf_22bf96::ChangeInstructionTo
                        (pVVar29,pVVar36,VVar22,&pVVar20->super_VmValue,pVVar15,(VmValue *)0x0,
                         (VmValue *)0x0,(VmValue *)0x0,optCount);
            }
          }
          pVVar36 = pVVar34;
        } while (pVVar34 != (VmInstruction *)0x0);
        pVVar36 = (VmInstruction *)value[1].comment.end;
        pVVar29 = pVVar38;
        if (pVVar36 != (VmInstruction *)0x0) {
          do {
            VVar22 = pVVar36->cmd;
            pVVar34 = pVVar36;
            if (VVar22 - VM_INST_STORE_BYTE < 7) {
              do {
                pVVar34 = pVVar34->prevSibling;
                if (pVVar34 == (VmInstruction *)0x0) goto LAB_0027dada;
                cmd = pVVar34->cmd;
                bVar11 = anon_unknown.dwarf_22bf96::HasMemoryAccess(cmd);
              } while (!bVar11);
              if (cmd == VVar22) {
                uVar13 = (pVVar34->arguments).count;
                if (uVar13 == 0) goto LAB_0027dcf2;
                ppVVar8 = (pVVar34->arguments).data;
                pVVar20 = (VmConstant *)*ppVVar8;
                if ((pVVar20 == (VmConstant *)0x0) ||
                   (pVVar27 = pVVar20, (pVVar20->super_VmValue).typeID != 1)) {
                  pVVar27 = (VmConstant *)0x0;
                }
                if (uVar13 == 1) goto LAB_0027dcf2;
                pVVar15 = ppVVar8[1];
                if ((pVVar15 == (VmValue *)0x0) || (pVVar15->typeID != 1)) {
                  pVVar15 = (VmValue *)0x0;
                }
                uVar13 = (pVVar36->arguments).count;
                if (uVar13 == 0) goto LAB_0027dcf2;
                ppVVar8 = (pVVar36->arguments).data;
                pVVar23 = (VmConstant *)*ppVVar8;
                if ((pVVar23 == (VmConstant *)0x0) ||
                   (this_01 = pVVar23, (pVVar23->super_VmValue).typeID != 1)) {
                  this_01 = (VmConstant *)0x0;
                }
                if (uVar13 == 1) goto LAB_0027dcf2;
                pVVar37 = ppVVar8[1];
                if ((pVVar37 == (VmValue *)0x0) || (pVVar37->typeID != 1)) {
                  pVVar37 = (VmValue *)0x0;
                }
                if ((pVVar27 == (VmConstant *)0x0) || (this_01 == (VmConstant *)0x0)) {
                  if (pVVar20 == pVVar23) goto LAB_0027dab7;
                }
                else {
                  bVar11 = VmConstant::operator==(this_01,pVVar27);
                  if (bVar11) {
LAB_0027dab7:
                    if (*(int *)&pVVar15[1]._vptr_VmValue == *(int *)&pVVar37[1]._vptr_VmValue) {
                      VmBlock::RemoveInstruction((VmBlock *)value,pVVar34);
                      pVVar38->loadStorePropagations = pVVar38->loadStorePropagations + 1;
                    }
                  }
                }
              }
            }
LAB_0027dada:
            pVVar36 = pVVar36->nextSibling;
          } while (pVVar36 != (VmInstruction *)0x0);
          pVVar36 = (VmInstruction *)value[1].comment.end;
LAB_0027daf6:
          pVVar34 = pVVar36;
          if (pVVar34 != (VmInstruction *)0x0) {
            pVVar36 = pVVar34->nextSibling;
            if (pVVar34->cmd - VM_INST_LOAD_INT < 5) {
              uVar13 = (pVVar34->arguments).count;
              if ((uVar13 == 0) || (uVar13 == 1)) {
LAB_0027dcf2:
                __assert_fail("index < count",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                              ,0x199,
                              "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                             );
              }
              ppVVar8 = (pVVar34->arguments).data;
              pVVar15 = ppVVar8[1];
              if ((pVVar15 == (VmValue *)0x0) || (pVVar15->typeID != 1)) {
                pVVar15 = (VmValue *)0x0;
              }
              pVVar37 = *ppVVar8;
              if (((pVVar37 == (VmValue *)0x0) || (pVVar37->typeID != 1)) ||
                 (pVVar37[1].comment.end != (char *)0x0)) {
                pVVar38 = pVVar29;
                for (pVVar16 = pVVar34->prevSibling; pVVar29 = pVVar38,
                    pVVar16 != (VmInstruction *)0x0; pVVar16 = pVVar16->prevSibling) {
                  VVar22 = pVVar16->cmd;
                  bVar11 = anon_unknown.dwarf_22bf96::HasMemoryAccess(VVar22);
                  if (bVar11) {
                    pVVar29 = pVVar38;
                    if (VVar22 - VM_INST_STORE_INT < 5) {
                      uVar13 = (pVVar16->arguments).count;
                      if ((uVar13 == 0) || (uVar13 == 1)) goto LAB_0027dcf2;
                      ppVVar8 = (pVVar16->arguments).data;
                      pVVar24 = ppVVar8[1];
                      if ((pVVar24 == (VmValue *)0x0) || (pVVar24->typeID != 1)) {
                        pVVar24 = (VmValue *)0x0;
                      }
                      if (uVar13 < 3) goto LAB_0027dcf2;
                      pVVar17 = *ppVVar8;
                      replacement = (VmInstruction *)ppVVar8[2];
                      uVar13 = GetAccessSize(pVVar16);
                      uVar14 = GetAccessSize(pVVar34);
                      pVVar29 = pVVar38;
                      if (((uVar13 == uVar14) && (pVVar17 == pVVar37)) &&
                         ((*(int *)&pVVar24[1]._vptr_VmValue == *(int *)&pVVar15[1]._vptr_VmValue &&
                          ((pVVar34->super_VmValue).type.size ==
                           (replacement->super_VmValue).type.size)))) {
                        if ((pVVar34->super_VmValue).type.type !=
                            (replacement->super_VmValue).type.type) {
                          pVVar38->currentBlock = (VmBlock *)value;
                          value[1].users.data = (VmValue **)pVVar34->prevSibling;
                          type_00.structType = (TypeBase *)0x4e;
                          type_00._0_8_ = (pVVar34->super_VmValue).type.structType;
                          replacement = anon_unknown.dwarf_22bf96::CreateInstruction
                                                  ((anon_unknown_dwarf_22bf96 *)pVVar38,
                                                   (VmModule *)(pVVar34->super_VmValue).source,
                                                   *(SynBase **)&(pVVar34->super_VmValue).type,
                                                   type_00,(VmInstructionType)replacement,
                                                   (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                                                   (VmValue *)0x0,(VmValue *)pVVar38);
                          value[1].users.data = *(VmValue ***)&value[1].hasSideEffects;
                          pVVar38->currentBlock = (VmBlock *)0x0;
                        }
                        anon_unknown.dwarf_22bf96::ReplaceValueUsersWith
                                  (pVVar38,&pVVar34->super_VmValue,&replacement->super_VmValue,
                                   optCount);
                      }
                    }
                    break;
                  }
                }
              }
            }
            goto LAB_0027daf6;
          }
        }
      }
    }
    else if (value->typeID == 4) {
      module->currentFunction = (VmFunction *)value;
      pVVar15 = (VmValue *)value[1].source;
      pVVar38 = module;
      while (pVVar15 != (VmValue *)0x0) {
        pVVar37 = (VmValue *)pVVar15[1].comment.begin;
        RunLoadStorePropagation(ctx,module,pVVar15);
        pVVar15 = pVVar37;
      }
      uVar13 = *(uint *)(value[1].users.little + 2);
      if (uVar13 != 0) {
        uVar33 = 0;
        do {
          pVVar15 = (value[1].users.little[1]->users).little[uVar33 - 10];
          uVar14 = *(uint *)(pVVar15->users).little;
          uVar35 = (ulong)uVar14;
          if (uVar35 == 0) {
            local_38 = module->allocator;
            local_148._0_8_ = local_148 + 0x10;
            local_148._8_8_ = 0x2000000000;
          }
          else {
            uVar25 = 0;
            do {
              lVar30 = *(long *)(*(long *)&(pVVar15->users).count + uVar25 * 8);
              if ((ulong)*(uint *)(lVar30 + 0x48) != 0) {
                uVar32 = 0;
                do {
                  lVar2 = *(long *)(*(long *)(lVar30 + 0x40) + uVar32 * 8);
                  if ((lVar2 == 0) || (*(int *)(lVar2 + 8) != 2)) {
                    __assert_fail("!\"invalid constant use\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                  ,0x14a8,
                                  "void RunLoadStorePropagation(ExpressionContext &, VmModule *, VmValue *)"
                                 );
                  }
                  iVar12 = *(int *)(lVar2 + 0x98);
                  if ((iVar12 - 8U < 7) || (iVar12 == 0x1a)) {
                    if (*(int *)(lVar2 + 0xa8) == 0) goto LAB_0027dcf2;
                    if (**(long **)(lVar2 + 0xa0) != lVar30) goto LAB_0027cdf5;
                  }
                  else {
                    if (iVar12 != 0x1b) goto LAB_0027cdf5;
                    if (*(uint *)(lVar2 + 0xa8) == 0) goto LAB_0027dcf2;
                    lVar3 = **(long **)(lVar2 + 0xa0);
                    if (lVar3 != lVar30) {
                      if (*(uint *)(lVar2 + 0xa8) < 3) goto LAB_0027dcf2;
                      if (((((*(long **)(lVar2 + 0xa0))[2] != lVar30) || (lVar3 == 0)) ||
                          (*(int *)(lVar3 + 8) != 1)) ||
                         (*(long *)(lVar3 + 200) != *(long *)(lVar30 + 200))) goto LAB_0027cdf5;
                    }
                  }
                  uVar32 = uVar32 + 1;
                } while (*(uint *)(lVar30 + 0x48) != uVar32);
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != uVar35);
            local_38 = module->allocator;
            local_148._0_8_ = local_148 + 0x10;
            local_148._8_8_ = 0x2000000000;
            if (uVar14 != 0) {
              uVar25 = 0;
              uVar32 = 0;
              do {
                lVar30 = *(long *)(*(long *)&(pVVar15->users).count + uVar32 * 8);
                uVar13 = *(uint *)(lVar30 + 0x48);
                if (uVar13 != 0) {
                  uVar35 = 0;
                  module = pVVar38;
                  do {
                    pVVar37 = *(VmValue **)(*(long *)(lVar30 + 0x40) + uVar35 * 8);
                    if ((pVVar37 != (VmValue *)0x0) && (pVVar37->typeID == 2)) {
                      if ((uint)uVar25 == local_148._12_4_) {
                        SmallArray<VmInstruction_*,_32U>::grow
                                  ((SmallArray<VmInstruction_*,_32U> *)local_148,(uint)uVar25);
                      }
                      if ((VmConstant *)local_148._0_8_ == (VmConstant *)0x0) {
                        pcVar21 = 
                        "void SmallArray<VmInstruction *, 32>::push_back(const T &) [T = VmInstruction *, N = 32]"
                        ;
                        goto LAB_0027dd26;
                      }
                      uVar19 = local_148._8_8_ & 0xffffffff;
                      uVar25 = (ulong)(local_148._8_4_ + 1);
                      local_148._8_4_ = local_148._8_4_ + 1;
                      (((VmValue *)local_148._0_8_)->users).little[uVar19 - 10] = pVVar37;
                      uVar13 = *(uint *)(lVar30 + 0x48);
                    }
                    uVar35 = uVar35 + 1;
                  } while (uVar35 < uVar13);
                  uVar35 = (ulong)*(uint *)(pVVar15->users).little;
                  pVVar38 = module;
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 < uVar35);
              if ((int)uVar25 != 0) {
                uVar35 = 0;
                do {
                  pVVar36 = (VmInstruction *)
                            (((VmValue *)local_148._0_8_)->users).little[uVar35 - 10];
                  this_00 = pVVar36->parent;
                  if (this_00 != (VmBlock *)0x0) {
                    VmBlock::RemoveInstruction(this_00,pVVar36);
                    uVar25 = local_148._8_8_ & 0xffffffff;
                  }
                  module->loadStorePropagations = module->loadStorePropagations + 1;
                  uVar35 = uVar35 + 1;
                } while (uVar35 < uVar25);
              }
            }
          }
          SmallArray<VmInstruction_*,_32U>::~SmallArray
                    ((SmallArray<VmInstruction_*,_32U> *)local_148);
          uVar13 = *(uint *)(value[1].users.little + 2);
LAB_0027cdf5:
          uVar33 = uVar33 + 1;
        } while (uVar33 < uVar13);
      }
      module->currentFunction = (VmFunction *)0x0;
    }
  }
  return;
}

Assistant:

void RunLoadStorePropagation(ExpressionContext &ctx, VmModule *module, VmValue *value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunLoadStorePropagation(ctx, module, curr);
			curr = next;
		}

		// Remove allocas that are only used by stores
		for(unsigned i = 0; i < function->allocas.size(); i++)
		{
			VariableData *variable = function->allocas[i];

			bool nonStoreUse = false;

			for(unsigned k = 0; k < variable->users.size(); k++)
			{
				VmConstant *user = variable->users[k];

				for(unsigned l = 0; l < user->users.size(); l++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(user->users[l]))
					{
						if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
							continue;

						if(inst->cmd == VM_INST_MEM_COPY && inst->arguments[0] == user)
							continue;

						if(inst->cmd == VM_INST_MEM_COPY && inst->arguments[2] == user)
						{
							if(VmConstant *dst = getType<VmConstant>(inst->arguments[0]))
							{
								// Copy to the same container the load is from is a circular use and doesn't count as non-store use
								if(dst->container == user->container)
									continue;
							}
						}

						if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
							continue;

						nonStoreUse = true;
						break;
					}
					else
					{
						assert(!"invalid constant use");
					}
				}

				if(nonStoreUse)
					break;
			}

			if(!nonStoreUse)
			{
				SmallArray<VmInstruction*, 32> deadStores(module->allocator);

				for(unsigned k = 0; k < variable->users.size(); k++)
				{
					VmConstant *user = variable->users[k];

					for(unsigned l = 0; l < user->users.size(); l++)
					{
						if(VmInstruction *inst = getType<VmInstruction>(user->users[l]))
							deadStores.push_back(inst);
					}
				}

				for(unsigned k = 0; k < deadStores.size(); k++)
				{
					VmInstruction *inst = deadStores[k];

					if(inst->parent)
						inst->parent->RemoveInstruction(inst);

					module->loadStorePropagations++;
				}
			}
		}

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		// Handle loads and stores to constant global or frame addresses
		ClearLoadStoreInfo(module);

		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			switch(curr->cmd)
			{
			case VM_INST_LOAD_BYTE:
				if(VmValue* prevValue = GetLoadStoreInfo(module, curr))
				{
					if(VmConstant* constant = getType<VmConstant>(prevValue))
					{
						ReplaceValueUsersWith(module, curr, CreateConstantInt(module->allocator, prevValue->source, (int)(char)(constant->iValue)), &module->loadStorePropagations);
						break;
					}
				}

				AddLoadInfo(module, curr);
				break;
			case VM_INST_LOAD_SHORT:
				if(VmValue* prevValue = GetLoadStoreInfo(module, curr))
				{
					if(VmConstant* constant = getType<VmConstant>(prevValue))
					{
						ReplaceValueUsersWith(module, curr, CreateConstantInt(module->allocator, prevValue->source, (int)(short)(constant->iValue)), &module->loadStorePropagations);
						break;
					}
				}

				AddLoadInfo(module, curr);
				break;
			case VM_INST_LOAD_INT:
			case VM_INST_LOAD_FLOAT:
			case VM_INST_LOAD_DOUBLE:
			case VM_INST_LOAD_LONG:
			case VM_INST_LOAD_STRUCT:
				if(VmValue* prevValue = GetLoadStoreInfo(module, curr))
				{
					if(curr->type != prevValue->type)
					{
						assert(curr->type.size == prevValue->type.size);

						module->currentBlock = block;

						block->insertPoint = curr->prevSibling;

						prevValue = CreateBitcast(module, curr->source, curr->type, prevValue);

						block->insertPoint = block->lastInstruction;

						module->currentBlock = NULL;

						ReplaceValueUsersWith(module, curr, prevValue, &module->loadStorePropagations);
					}
					else
					{
						ReplaceValueUsersWith(module, curr, prevValue, &module->loadStorePropagations);
					}

					break;
				}

				AddLoadInfo(module, curr);
				break;
			case VM_INST_STORE_BYTE:
			case VM_INST_STORE_SHORT:
			case VM_INST_STORE_INT:
			case VM_INST_STORE_FLOAT:
			case VM_INST_STORE_DOUBLE:
			case VM_INST_STORE_LONG:
			case VM_INST_STORE_STRUCT:
				AddStoreInfo(module, curr);
				break;
			case VM_INST_MEM_COPY:
				{
					VmValue *address = curr->arguments[2];
					VmConstant *offset = getType<VmConstant>(curr->arguments[3]);

					if(VmInstruction* prevCopy = GetCopyInfo(module, address, offset, GetAccessSize(curr)))
					{
						ChangeInstructionTo(module, curr, curr->cmd, curr->arguments[0], curr->arguments[1], prevCopy->arguments[2], prevCopy->arguments[3], curr->arguments[4], &module->loadStorePropagations);
					}
				}

				AddCopyInfo(module, curr);
				break;
			case VM_INST_SET_RANGE:
				ClearLoadStoreInfoAliasing(module, NULL);
				ClearLoadStoreInfoGlobal(module);
				break;
			case VM_INST_CALL:
				unsigned firstArgument;
				VmFunction *targetFunction;

				if(curr->arguments[0]->type.type == VM_TYPE_FUNCTION_REF)
				{
					firstArgument = 2;

					targetFunction = NULL;
				}
				else
				{
					firstArgument = 3;

					targetFunction = getType<VmFunction>(curr->arguments[1]);
				}

				for(unsigned i = firstArgument; i < curr->arguments.size(); i++)
				{
					if(VmConstant *constant = getType<VmConstant>(curr->arguments[i]))
					{
						if(constant->isReference)
						{
							if(VmInstruction* prevCopy = GetCopyInfo(module, constant, NULL, constant->type.size))
							{
								if(VmConstant *constAddress = getType<VmConstant>(prevCopy->arguments[2]))
								{
									VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, constant->type, curr->source);

									reference->iValue = constAddress->iValue;
									reference->container = constAddress->container;
									reference->isReference = true;

									reference->container->users.push_back(reference);

									reference->comment = constant->comment;

									reference->AddUse(curr);
									curr->arguments[i]->RemoveUse(curr);

									curr->arguments[i] = reference;
								}
							}
						}
					}
				}

				if(VmConstant *constant = getType<VmConstant>(curr->arguments[firstArgument - 1]))
				{
					if(constant->isReference)
					{
						// Remove previous loads and stores to the address range of the return value
						ClearLoadStoreInfo(module, constant->container, unsigned(constant->iValue), constant->type.size);
					}
				}

				if(targetFunction)
				{
					if((targetFunction->function->attributes & (1 << NULLC_ATTRIBUTE_NO_MEMORY_WRITE)) != 0)
						break;
				}

				ClearLoadStoreInfoAliasing(module, NULL);
				ClearLoadStoreInfoGlobal(module);
				break;
			case VM_INST_RETURN:
				if(!curr->arguments.empty())
				{
					if(VmConstant *constant = getType<VmConstant>(curr->arguments[0]))
					{
						if(constant->isReference)
						{
							if(VmInstruction* prevCopy = GetCopyInfo(module, constant, NULL, constant->type.size))
							{
								if(VmConstant *constAddress = getType<VmConstant>(prevCopy->arguments[2]))
								{
									VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, constant->type, curr->source);

									reference->iValue = constAddress->iValue;
									reference->container = constAddress->container;
									reference->isReference = true;

									reference->container->users.push_back(reference);

									ChangeInstructionTo(module, curr, curr->cmd, reference, NULL, NULL, NULL, NULL, &module->loadStorePropagations);
								}
							}
						}
					}
				}
				break;
			case VM_INST_ADD_LOAD:
			case VM_INST_SUB_LOAD:
			case VM_INST_MUL_LOAD:
			case VM_INST_DIV_LOAD:
			case VM_INST_POW_LOAD:
			case VM_INST_MOD_LOAD:
			case VM_INST_LESS_LOAD:
			case VM_INST_GREATER_LOAD:
			case VM_INST_LESS_EQUAL_LOAD:
			case VM_INST_GREATER_EQUAL_LOAD:
			case VM_INST_EQUAL_LOAD:
			case VM_INST_NOT_EQUAL_LOAD:
			case VM_INST_SHL_LOAD:
			case VM_INST_SHR_LOAD:
			case VM_INST_BIT_AND_LOAD:
			case VM_INST_BIT_OR_LOAD:
			case VM_INST_BIT_XOR_LOAD:
			{
				VmValue *loadPointer = curr->arguments[1];
				VmConstant *loadOffset = getType<VmConstant>(curr->arguments[2]);
				VmConstant *loadInst = getType<VmConstant>(curr->arguments[3]);

				unsigned loadSize = 0;

				switch(loadInst->iValue)
				{
				case VM_INST_LOAD_INT:
				case VM_INST_LOAD_FLOAT:
					loadSize = 4;
					break;
				case VM_INST_LOAD_DOUBLE:
				case VM_INST_LOAD_LONG:
					loadSize = 8;
					break;
				}

				assert(loadSize);

				unsigned accessSize = GetAccessSize(curr);

				if(VmValue* prevValue = GetLoadStoreInfo(module, loadPointer, loadOffset, loadSize, accessSize, VmInstructionType(loadInst->iValue)))
					ChangeInstructionTo(module, curr, GetOperationWithoutLoad(curr->cmd), curr->arguments[0], prevValue, NULL, NULL, NULL, &module->loadStorePropagations);
			}
				break;
			default:
				break;
			}

			curr = next;
		}

		// Handle consecutive stores to the same address
		for(VmInstruction *curr = block->firstInstruction; curr; curr = curr->nextSibling)
		{
			if(curr->cmd >= VM_INST_STORE_BYTE && curr->cmd <= VM_INST_STORE_STRUCT)
			{
				// Walk up until a memory write is reached
				VmInstruction *prev = curr->prevSibling;

				while(prev && !HasMemoryAccess(prev->cmd))
					prev = prev->prevSibling;

				if(prev && prev->cmd == curr->cmd)
				{
					bool same = false;

					VmConstant *prevAddressAsConst = getType<VmConstant>(prev->arguments[0]);
					VmConstant *prevOffset = getType<VmConstant>(prev->arguments[1]);

					VmConstant *currAddressAsConst = getType<VmConstant>(curr->arguments[0]);
					VmConstant *currOffset = getType<VmConstant>(curr->arguments[1]);

					if(currAddressAsConst && prevAddressAsConst)
						same = *currAddressAsConst == *prevAddressAsConst && prevOffset->iValue == currOffset->iValue;
					else
						same = prev->arguments[0] == curr->arguments[0] && prevOffset->iValue == currOffset->iValue;

					if(same)
					{
						block->RemoveInstruction(prev);

						module->loadStorePropagations++;
					}
				}
			}
		}

		// Handle immediate loads from the same address as a store
		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			if(curr->cmd >= VM_INST_LOAD_INT && curr->cmd <= VM_INST_LOAD_STRUCT)
			{
				VmValue *loadPointer = curr->arguments[0];
				VmConstant *loadOffset = getType<VmConstant>(curr->arguments[1]);

				// Skip reads of direct addresses (usually from null pointer access)
				if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
				{
					if(!loadAddress->container)
					{
						curr = next;
						continue;
					}
				}

				// Walk up until a memory write is reached
				VmInstruction *prev = curr->prevSibling;

				while(prev && !HasMemoryAccess(prev->cmd))
					prev = prev->prevSibling;

				if(prev && (prev->cmd >= VM_INST_STORE_INT && prev->cmd <= VM_INST_STORE_STRUCT))
				{
					VmValue *storePointer = prev->arguments[0];
					VmConstant *storeOffset = getType<VmConstant>(prev->arguments[1]);
					VmValue *storeValue = prev->arguments[2];

					if(GetAccessSize(prev) == GetAccessSize(curr) && storePointer == loadPointer && storeOffset->iValue == loadOffset->iValue && curr->type.size == storeValue->type.size)
					{
						if(curr->type != storeValue->type)
						{
							module->currentBlock = block;

							block->insertPoint = curr->prevSibling;

							storeValue = CreateBitcast(module, curr->source, curr->type, storeValue);

							block->insertPoint = block->lastInstruction;

							module->currentBlock = NULL;

							ReplaceValueUsersWith(module, curr, storeValue, &module->loadStorePropagations);
						}
						else
						{
							ReplaceValueUsersWith(module, curr, storeValue, &module->loadStorePropagations);
						}
					}
				}
			}

			curr = next;
		}
	}
}